

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O2

bool deqp::egl::anon_unknown_0::compareToReference
               (TestLog *log,char *name,char *description,Surface *reference,Surface *screen,int x,
               int y,int width,int height)

{
  bool bVar1;
  ConstPixelBufferAccess local_d0;
  ConstPixelBufferAccess local_a8;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  tcu::Surface::getAccess(&local_58,reference);
  tcu::getSubregion(&local_d0,&local_58,x,y,width,height);
  tcu::Surface::getAccess(&local_a8,screen);
  tcu::getSubregion(&local_80,&local_a8,x,y,width,height);
  bVar1 = tcu::fuzzyCompare(log,name,description,&local_d0,&local_80,0.05,COMPARE_LOG_RESULT);
  return bVar1;
}

Assistant:

bool compareToReference (tcu::TestLog& log, const char* name, const char* description, const tcu::Surface& reference, const tcu::Surface& screen, int x, int y, int width, int height)
{
	return tcu::fuzzyCompare(log, name, description,
							 getSubregion(reference.getAccess(), x, y, width, height),
							 getSubregion(screen.getAccess(), x, y, width, height),
							 0.05f, tcu::COMPARE_LOG_RESULT);
}